

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

void __thiscall UDMFParser::ParseTextMap(UDMFParser *this,MapData *map)

{
  uint uVar1;
  FileReader *pFVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  char *pcVar7;
  char *name;
  Node *pNVar8;
  size_t sVar9;
  sector_t_conflict *__dest;
  ulong *puVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  size_t __n;
  ulong uVar16;
  vertex_t vt;
  FMapThing th;
  
  pFVar2 = map->MapLumps[1].Reader;
  iVar15 = 0;
  if (pFVar2 == (FileReader *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)(uint)pFVar2->Length;
  }
  pcVar7 = (char *)operator_new__(uVar12);
  this->isTranslated = true;
  this->isExtended = false;
  this->floordrop = false;
  MapData::Read(map,1,pcVar7,-1);
  name = FWadCollection::GetLumpFullName(&Wads,map->lumpnum);
  pFVar2 = map->MapLumps[1].Reader;
  if (pFVar2 != (FileReader *)0x0) {
    iVar15 = (int)pFVar2->Length;
  }
  FScanner::OpenMem((FScanner *)this,name,pcVar7,iVar15);
  operator_delete__(pcVar7);
  FScanner::SetCMode((FScanner *)this,true);
  bVar6 = FScanner::CheckString((FScanner *)this,"namespace");
  if (!bVar6) {
    Printf("Map does not define a namespace.\n");
    goto LAB_0045c334;
  }
  FScanner::MustGetStringName((FScanner *)this,"=");
  FScanner::MustGetString((FScanner *)this);
  FName::operator=(&(this->super_UDMFParserBase).namespc,(this->super_UDMFParserBase).sc.String);
  iVar15 = (this->super_UDMFParserBase).namespc.Index;
  switch(iVar15) {
  case 8:
    (this->super_UDMFParserBase).namespace_bits = 1;
    pcVar7 = "xlat/doom_base.txt";
    goto LAB_0045c271;
  case 9:
    (this->super_UDMFParserBase).namespace_bits = 2;
    pcVar7 = "xlat/heretic_base.txt";
LAB_0045c271:
    P_LoadTranslator(pcVar7);
    level.flags2._2_1_ = level.flags2._2_1_ | 0x40;
LAB_0045c2b3:
    this->floordrop = true;
    break;
  case 10:
switchD_0045c231_caseD_a:
    (this->super_UDMFParserBase).namespace_bits = 4;
LAB_0045c31e:
    this->isTranslated = false;
    break;
  case 0xb:
    (this->super_UDMFParserBase).namespace_bits = 8;
    P_LoadTranslator("xlat/strife_base.txt");
    level.flags2._2_1_ = level.flags2._2_1_ | 0x60;
    goto LAB_0045c2b3;
  default:
    if (iVar15 == 0x18e) {
      (this->super_UDMFParserBase).namespace_bits = 0x40;
      goto LAB_0045c31e;
    }
    if (iVar15 == 0x18d) {
      level.flags2._2_1_ = level.flags2._2_1_ | 0x40;
      (this->super_UDMFParserBase).namespace_bits = 0x20;
    }
    else {
      if (iVar15 == 0x18c) {
        (this->super_UDMFParserBase).namespace_bits = 0x10;
        goto LAB_0045c31e;
      }
      Printf("Unknown namespace %s. Using defaults for %s\n",(this->super_UDMFParserBase).sc.String,
             GameNames[gameinfo.gametype]);
      if (gameinfo.gametype == GAME_Heretic) {
        (this->super_UDMFParserBase).namespace_bits = 2;
        pcVar7 = "xlat/heretic_base.txt";
      }
      else {
        if (gameinfo.gametype == GAME_Hexen) goto switchD_0045c231_caseD_a;
        if (gameinfo.gametype == GAME_Strife) {
          (this->super_UDMFParserBase).namespace_bits = 8;
          pcVar7 = "xlat/strife_base.txt";
        }
        else {
          (this->super_UDMFParserBase).namespace_bits = 1;
          pcVar7 = "xlat/doom_base.txt";
        }
      }
      P_LoadTranslator(pcVar7);
    }
  }
  FScanner::MustGetStringName((FScanner *)this,";");
LAB_0045c334:
  while (bVar6 = FScanner::GetString((FScanner *)this), bVar6) {
    bVar6 = FScanner::Compare((FScanner *)this,"thing");
    uVar1 = MapThingsUserData.Count;
    if (bVar6) {
      ParseThing(this,&th);
      TArray<FMapThing,_FMapThing>::Push(&MapThingsConverted,&th);
      if (uVar1 < MapThingsUserData.Count) {
        pNVar8 = TMap<unsigned_int,_unsigned_int,_THashTraits<unsigned_int>,_TValueTraits<unsigned_int>_>
                 ::GetNode(&MapThingsUserDataIndex,MapThingsConverted.Count - 1);
        (pNVar8->Pair).Value = uVar1;
        vt.p.X = 0.0;
        TArray<FMapThingUserData,_FMapThingUserData>::Push
                  (&MapThingsUserData,(FMapThingUserData *)&vt);
      }
    }
    else {
      bVar6 = FScanner::Compare((FScanner *)this,"linedef");
      if (bVar6) {
        ParseLinedef(this,(line_t_conflict *)&th,(this->ParsedLines).Count);
        TArray<line_t,_line_t>::Push(&this->ParsedLines,(line_t_conflict *)&th);
      }
      else {
        bVar6 = FScanner::Compare((FScanner *)this,"sidedef");
        if (bVar6) {
          vt.p.X = 3.68703207501814e-317;
          vt.p.Y = 3.68703207501814e-317;
          FString::NullString.RefCount = FString::NullString.RefCount + 3;
          ParseSidedef(this,(side_t *)&th,(intmapsidedef_t *)&vt,(this->ParsedSides).Count);
          TArray<side_t,_side_t>::Push(&this->ParsedSides,(side_t *)&th);
          TArray<intmapsidedef_t,_intmapsidedef_t>::Push
                    (&this->ParsedSideTextures,(intmapsidedef_t *)&vt);
          intmapsidedef_t::~intmapsidedef_t((intmapsidedef_t *)&vt);
        }
        else {
          bVar6 = FScanner::Compare((FScanner *)this,"sector");
          if (bVar6) {
            ParseSector(this,(sector_t_conflict *)&th,(this->ParsedSectors).Count);
            TArray<sector_t,_sector_t>::Push(&this->ParsedSectors,(sector_t_conflict *)&th);
          }
          else {
            bVar6 = FScanner::Compare((FScanner *)this,"vertex");
            if (bVar6) {
              ParseVertex(this,&vt,(vertexdata_t *)&th);
              TArray<vertex_t,_vertex_t>::Push(&this->ParsedVertices,&vt);
              TArray<vertexdata_t,_vertexdata_t>::Push(&this->ParsedVertexDatas,(vertexdata_t *)&th)
              ;
            }
            else {
              UDMFParserBase::Skip(&this->super_UDMFParserBase);
            }
          }
        }
      }
    }
  }
  if ((this->ParsedVertices).Count == 0) {
    I_Error("Map has no vertices.\n");
  }
  if ((this->ParsedSectors).Count == 0) {
    I_Error("Map has no sectors. \n");
  }
  if ((this->ParsedLines).Count == 0) {
    I_Error("Map has no linedefs.\n");
  }
  if ((this->ParsedSides).Count == 0) {
    I_Error("Map has no sidedefs.\n");
  }
  numvertexes = (this->ParsedVertices).Count;
  __n = (long)numvertexes << 4;
  uVar12 = 0xffffffffffffffff;
  sVar9 = __n;
  if ((long)numvertexes < 0) {
    sVar9 = uVar12;
  }
  vertexes = (vertex_t *)operator_new__(sVar9);
  memcpy(vertexes,(this->ParsedVertices).Array,__n);
  numvertexdatas = (this->ParsedVertexDatas).Count;
  uVar16 = (ulong)numvertexdatas;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar16;
  uVar11 = SUB168(auVar3 * ZEXT816(0x18),0);
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
    uVar11 = uVar12;
  }
  vertexdatas = (vertexdata_t *)operator_new__(uVar11);
  memcpy(vertexdatas,(this->ParsedVertexDatas).Array,uVar16 * 0x18);
  uVar1 = (this->ParsedSectors).Count;
  uVar14 = (ulong)(int)uVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar14;
  uVar16 = SUB168(auVar4 * ZEXT816(0xa0),0);
  uVar11 = uVar16 | 8;
  if (SUB168(auVar4 * ZEXT816(0xa0),8) != 0) {
    uVar11 = uVar12;
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar14;
  sVar9 = SUB168(auVar5 * ZEXT816(0x218),0);
  if (SUB168(auVar5 * ZEXT816(0x218),8) == 0) {
    uVar12 = sVar9;
  }
  numsectors = uVar1;
  __dest = (sector_t_conflict *)operator_new__(uVar12);
  sectors = __dest;
  memcpy(__dest,(this->ParsedSectors).Array,sVar9);
  puVar10 = (ulong *)operator_new__(uVar11);
  *puVar10 = uVar14;
  if (uVar1 != 0) {
    uVar16 = uVar16 - 0xa0;
    memset((extsector_t *)(puVar10 + 1),0,(uVar16 - uVar16 % 0xa0) + 0xa0);
  }
  __dest->e = (extsector_t *)(puVar10 + 1);
  uVar11 = 0;
  uVar12 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar12 = uVar11;
  }
  lVar13 = 0x210;
  for (; uVar12 * 0xa0 - uVar11 != 0; uVar11 = uVar11 + 0xa0) {
    *(ulong *)((long)&sectors->planes[0].xform.xOffs + lVar13) =
         (long)&(sectors->e->FakeFloor).Sectors.Array + uVar11;
    lVar13 = lVar13 + 0x218;
  }
  ProcessLineDefs(this);
  return;
}

Assistant:

void ParseTextMap(MapData *map)
	{
		char *buffer = new char[map->Size(ML_TEXTMAP)];

		isTranslated = true;
		isExtended = false;
		floordrop = false;

		map->Read(ML_TEXTMAP, buffer);
		sc.OpenMem(Wads.GetLumpFullName(map->lumpnum), buffer, map->Size(ML_TEXTMAP));
		delete [] buffer;
		sc.SetCMode(true);
		if (sc.CheckString("namespace"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
			namespc = sc.String;
			switch(namespc)
			{
			case NAME_ZDoom:
				namespace_bits = Zd;
				isTranslated = false;
				break;
			case NAME_ZDoomTranslated:
				level.flags2 |= LEVEL2_DUMMYSWITCHES;
				namespace_bits = Zdt;
				break;
			case NAME_Vavoom:
				namespace_bits = Va;
				isTranslated = false;
				break;
			case NAME_Hexen:
				namespace_bits = Hx;
				isTranslated = false;
				break;
			case NAME_Doom:
				namespace_bits = Dm;
				P_LoadTranslator("xlat/doom_base.txt");
				level.flags2 |= LEVEL2_DUMMYSWITCHES;
				floordrop = true;
				break;
			case NAME_Heretic:
				namespace_bits = Ht;
				P_LoadTranslator("xlat/heretic_base.txt");
				level.flags2 |= LEVEL2_DUMMYSWITCHES;
				floordrop = true;
				break;
			case NAME_Strife:
				namespace_bits = St;
				P_LoadTranslator("xlat/strife_base.txt");
				level.flags2 |= LEVEL2_DUMMYSWITCHES|LEVEL2_RAILINGHACK;
				floordrop = true;
				break;
			default:
				Printf("Unknown namespace %s. Using defaults for %s\n", sc.String, GameTypeName());
				switch (gameinfo.gametype)
				{
				default:			// Shh, GCC
				case GAME_Doom:
				case GAME_Chex:
					namespace_bits = Dm;
					P_LoadTranslator("xlat/doom_base.txt");
					break;
				case GAME_Heretic:
					namespace_bits = Ht;
					P_LoadTranslator("xlat/heretic_base.txt");
					break;
				case GAME_Strife:
					namespace_bits = St;
					P_LoadTranslator("xlat/strife_base.txt");
					break;
				case GAME_Hexen:
					namespace_bits = Hx;
					isTranslated = false;
					break;
				}
			}
			sc.MustGetStringName(";");
		}
		else
		{
			Printf("Map does not define a namespace.\n");
		}

		while (sc.GetString())
		{
			if (sc.Compare("thing"))
			{
				FMapThing th;
				unsigned userdatastart = MapThingsUserData.Size();
				ParseThing(&th);
				MapThingsConverted.Push(th);
				if (userdatastart < MapThingsUserData.Size())
				{ // User data added
					MapThingsUserDataIndex[MapThingsConverted.Size()-1] = userdatastart;
					// Mark end of the user data for this map thing
					FMapThingUserData ud;
					ud.Property = NAME_None;
					ud.Value = 0;
					MapThingsUserData.Push(ud);
				}
			}
			else if (sc.Compare("linedef"))
			{
				line_t li;
				ParseLinedef(&li, ParsedLines.Size());
				ParsedLines.Push(li);
			}
			else if (sc.Compare("sidedef"))
			{
				side_t si;
				intmapsidedef_t st;
				ParseSidedef(&si, &st, ParsedSides.Size());
				ParsedSides.Push(si);
				ParsedSideTextures.Push(st);
			}
			else if (sc.Compare("sector"))
			{
				sector_t sec;
				ParseSector(&sec, ParsedSectors.Size());
				ParsedSectors.Push(sec);
			}
			else if (sc.Compare("vertex"))
			{
				vertex_t vt;
				vertexdata_t vd;
				ParseVertex(&vt, &vd);
				ParsedVertices.Push(vt);
				ParsedVertexDatas.Push(vd);
			}
			else
			{
				Skip();
			}
		}

		// Catch bogus maps here rather than during nodebuilding
		if (ParsedVertices.Size() == 0)	I_Error("Map has no vertices.\n");
		if (ParsedSectors.Size() == 0)	I_Error("Map has no sectors. \n");
		if (ParsedLines.Size() == 0)	I_Error("Map has no linedefs.\n");
		if (ParsedSides.Size() == 0)	I_Error("Map has no sidedefs.\n");

		// Create the real vertices
		numvertexes = ParsedVertices.Size();
		vertexes = new vertex_t[numvertexes];
		memcpy(vertexes, &ParsedVertices[0], numvertexes * sizeof(*vertexes));

		// Create the real vertex datas
		numvertexdatas = ParsedVertexDatas.Size();
		vertexdatas = new vertexdata_t[numvertexdatas];
		memcpy(vertexdatas, &ParsedVertexDatas[0], numvertexdatas * sizeof(*vertexdatas));

		// Create the real sectors
		numsectors = ParsedSectors.Size();
		sectors = new sector_t[numsectors];
		memcpy(sectors, &ParsedSectors[0], numsectors * sizeof(*sectors));
		sectors[0].e = new extsector_t[numsectors];
		for(int i = 0; i < numsectors; i++)
		{
			sectors[i].e = &sectors[0].e[i];
		}

		// Create the real linedefs and decompress the sidedefs
		ProcessLineDefs();
	}